

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

bool __thiscall
ICM::Compiler::PreliminaryCompile::compileIfSub
          (PreliminaryCompile *this,NodeRange *nr,VecElt *condList,
          vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
          *dolists)

{
  initializer_list<ICM::ASTBase::Element> __l;
  bool bVar1;
  KeywordID KVar2;
  Element *pEVar3;
  reference this_00;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  _Var4;
  Element EVar5;
  RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  local_108;
  undefined1 local_f8 [8];
  VecElt elsedolist;
  RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  local_d0;
  Element *local_c0;
  Element *e;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  iter;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  ie;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  ib;
  VecElt *dolist;
  allocator<ICM::ASTBase::Element> local_79;
  anon_union_4_2_4727c1b0_for_Element_0 local_78 [2];
  uint_t local_70;
  anon_union_4_2_4727c1b0_for_Element_0 *local_68;
  size_type local_60;
  vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> local_58;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_40;
  reference local_38;
  Element *bexp;
  vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  *dolists_local;
  VecElt *condList_local;
  NodeRange *nr_local;
  PreliminaryCompile *this_local;
  
  bexp = (Element *)dolists;
  dolists_local =
       (vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
        *)condList;
  condList_local = (VecElt *)nr;
  nr_local = (NodeRange *)this;
  local_40 = Common::
             RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
             ::begin(&nr->
                      super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
                    );
  local_38 = __gnu_cxx::
             __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
             ::operator*(&local_40);
  pEVar3 = adjustElement(this,local_38);
  checkBoolExp(this,pEVar3);
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::push_back
            ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)dolists_local,
             local_38);
  pEVar3 = bexp;
  EVar5 = ASTBase::Element::Keyword(do_);
  local_70 = EVar5.index;
  local_78[0] = EVar5.field_0;
  local_68 = local_78;
  local_60 = 1;
  std::allocator<ICM::ASTBase::Element>::allocator(&local_79);
  __l._M_len = local_60;
  __l._M_array = (iterator)local_68;
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::vector
            (&local_58,__l,&local_79);
  std::
  vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
  ::push_back((vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
               *)pEVar3,&local_58);
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::~vector(&local_58);
  std::allocator<ICM::ASTBase::Element>::~allocator(&local_79);
  this_00 = std::
            vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
            ::back((vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
                    *)bexp);
  ie = Common::
       RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
       ::begin((RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
                *)condList_local);
  _Var4 = __gnu_cxx::
          __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
          ::operator+(&ie,1);
  iter = Common::
         RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
         ::end((RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
                *)condList_local);
  e = (Element *)_Var4;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                        *)&e,&iter);
    if (!bVar1) {
      this_local._7_1_ = 1;
LAB_001deba2:
      return (bool)(this_local._7_1_ & 1);
    }
    local_c0 = __gnu_cxx::
               __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
               ::operator*((__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                            *)&e);
    bVar1 = ASTBase::Element::isKeyword(local_c0);
    if (bVar1) {
      KVar2 = ASTBase::Element::getKeyword(local_c0);
      if (KVar2 == elsif_) {
        _Var4 = __gnu_cxx::
                __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                ::operator+((__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                             *)&e,1);
        elsedolist.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = iter._M_current;
        local_d0 = (RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
                    )Common::
                     rangei<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element*,std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
                               (_Var4,iter);
        this_local._7_1_ =
             compileIfSub(this,(NodeRange *)&local_d0,(VecElt *)dolists_local,
                          (vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
                           *)bexp);
        goto LAB_001deba2;
      }
      KVar2 = ASTBase::Element::getKeyword(local_c0);
      if (KVar2 == else_) {
        _Var4 = __gnu_cxx::
                __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                ::operator+((__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                             *)&e,1);
        local_108 = (RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
                     )Common::
                      rangei<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element*,std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
                                (_Var4,iter);
        createDoList((VecElt *)local_f8,this,(NodeRange *)&local_108);
        std::
        vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
        ::push_back((vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
                     *)bexp,(VecElt *)local_f8);
        this_local._7_1_ = 1;
        std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::~vector
                  ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)local_f8
                  );
        goto LAB_001deba2;
      }
    }
    std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::push_back
              (this_00,local_c0);
    __gnu_cxx::
    __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
    ::operator++((__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
                  *)&e);
  } while( true );
}

Assistant:

bool compileIfSub(const NodeRange &nr, VecElt &condList, vector<VecElt> &dolists) {
				Element &bexp = *nr.begin();
				checkBoolExp(adjustElement(bexp));
				condList.push_back(bexp);
				dolists.push_back(VecElt{ Element::Keyword(do_) });
				VecElt &dolist = dolists.back();

				auto ib = nr.begin() + 1;
				auto ie = nr.end();
				for (auto iter = ib; iter != ie; ++iter) {
					Element &e = *iter;
					if (e.isKeyword()) {
						if (e.getKeyword() == elsif_) {
							return compileIfSub(rangei(iter + 1, ie), condList, dolists);
						}
						else if (e.getKeyword() == else_) {
							VecElt elsedolist = createDoList(rangei(iter + 1, ie));
							dolists.push_back(elsedolist);
							return true;
						}
					}
					dolist.push_back(e);
				}
				return true;
			}